

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidCrop2(void)

{
  pointer pcVar1;
  WeightParams *pWVar2;
  bool bVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  TypeUnion this;
  Type *this_00;
  LayerUnion this_01;
  ostream *poVar8;
  int iVar9;
  Result res;
  Model m1;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_78 + 0x10;
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  iVar9 = (pAVar7->shape_).current_size_;
  if (iVar9 == (pAVar7->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar7->shape_,iVar9 + 1);
    iVar9 = (pAVar7->shape_).current_size_;
  }
  (pAVar7->shape_).current_size_ = iVar9 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar9] = 1;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input2","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  iVar9 = (pAVar7->shape_).current_size_;
  if (iVar9 == (pAVar7->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar7->shape_,iVar9 + 1);
    iVar9 = (pAVar7->shape_).current_size_;
  }
  (pAVar7->shape_).current_size_ = iVar9 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar9] = 2;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"probs","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input2");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"probs");
  if (this_00->_oneof_case_[0] == 0xbe) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0xbe;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::CropLayerParams::CropLayerParams(this_01.crop_);
    (this_00->layer_).crop_ = (CropLayerParams *)this_01;
  }
  iVar9 = ((this_01.convolution_)->kernelsize_).current_size_;
  if (iVar9 == ((this_01.convolution_)->kernelsize_).total_size_) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&(this_01.convolution_)->kernelsize_,iVar9 + 1);
    iVar9 = ((this_01.convolution_)->kernelsize_).current_size_;
  }
  pWVar2 = (this_01.innerproduct_)->bias_;
  ((this_01.convolution_)->kernelsize_).current_size_ = iVar9 + 1;
  (&pWVar2->_internal_metadata_)[iVar9].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x1;
  CoreML::validate<(MLModelType)500>((Result *)local_78,&local_50);
  bVar3 = CoreML::Result::good((Result *)local_78);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0xec0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return (uint)bVar3;
}

Assistant:

int testInvalidCrop2() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *topIn2 = m1.mutable_description()->add_input();
    topIn2->set_name("input2");
    auto* shape2 = topIn2->mutable_type()->mutable_multiarraytype();
    shape2->add_shape(2);

    auto *out3 = m1.mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_multiarraytype();

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *cropLayer = nn->add_layers();
    cropLayer->add_input("input");
    cropLayer->add_input("input2");
    cropLayer->add_output("probs");
    auto *params = cropLayer->mutable_crop();
    params->add_offset(1);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    return 0;
}